

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct64_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  undefined1 *puVar10;
  undefined1 (*pauVar11) [32];
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i u [64];
  int local_8e0;
  int iStack_8dc;
  int iStack_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  int iStack_8c8;
  int iStack_8c4;
  int local_8c0;
  int iStack_8bc;
  int iStack_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int iStack_8a8;
  int iStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  
  lVar12 = (long)bit * 0x100;
  iVar17 = 1 << ((char)bit - 1U & 0x1f);
  auVar23._4_4_ = iVar17;
  auVar23._0_4_ = iVar17;
  auVar23._8_4_ = iVar17;
  auVar23._12_4_ = iVar17;
  auVar23._16_4_ = iVar17;
  auVar23._20_4_ = iVar17;
  auVar23._24_4_ = iVar17;
  auVar23._28_4_ = iVar17;
  iVar17 = bd + (uint)(do_cols == 0) * 2;
  local_8e0 = 0x8000;
  if (0xf < iVar17 + 6) {
    local_8e0 = 1 << ((char)iVar17 + 5U & 0x1f);
  }
  local_8c0 = -local_8e0;
  local_8e0 = local_8e0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x164);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x174);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x17c);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x184);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x18c);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar67._16_4_ = uVar1;
  auVar67._20_4_ = uVar1;
  auVar67._24_4_ = uVar1;
  auVar67._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x19c);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x23c);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x24c);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x25c);
  auVar61._4_4_ = uVar1;
  auVar61._0_4_ = uVar1;
  auVar61._8_4_ = uVar1;
  auVar61._12_4_ = uVar1;
  auVar61._16_4_ = uVar1;
  auVar61._20_4_ = uVar1;
  auVar61._24_4_ = uVar1;
  auVar61._28_4_ = uVar1;
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x224);
  auVar64._4_4_ = iVar17;
  auVar64._0_4_ = iVar17;
  auVar64._8_4_ = iVar17;
  auVar64._12_4_ = iVar17;
  auVar64._16_4_ = iVar17;
  auVar64._20_4_ = iVar17;
  auVar64._24_4_ = iVar17;
  auVar64._28_4_ = iVar17;
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x234);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x244);
  iVar2 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x254);
  alVar9 = *in;
  pauVar11 = &local_340;
  local_820[0] = alVar9[0];
  local_820[1] = alVar9[1];
  local_820[2] = alVar9[2];
  local_820[3] = alVar9[3];
  auVar3 = vpmulld_avx2((undefined1  [32])in[1],auVar55);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_40 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar56._4_4_ = iVar17;
  auVar56._0_4_ = iVar17;
  auVar56._8_4_ = iVar17;
  auVar56._12_4_ = iVar17;
  auVar56._16_4_ = iVar17;
  auVar56._20_4_ = iVar17;
  auVar56._24_4_ = iVar17;
  auVar56._28_4_ = iVar17;
  auVar3 = vpmulld_avx2((undefined1  [32])in[1],auVar61);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_420 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xf],auVar64);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar74 = ZEXT416((uint)bit);
  local_3c0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xf],auVar52);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[9],auVar49);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_c0 = vpsrad_avx2(auVar3,auVar74);
  auVar50._4_4_ = iVar15;
  auVar50._0_4_ = iVar15;
  auVar50._8_4_ = iVar15;
  auVar50._12_4_ = iVar15;
  auVar50._16_4_ = iVar15;
  auVar50._20_4_ = iVar15;
  auVar50._24_4_ = iVar15;
  auVar50._28_4_ = iVar15;
  auVar3 = vpmulld_avx2((undefined1  [32])in[9],auVar39);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_3a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[7],auVar50);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar74 = ZEXT416((uint)bit);
  local_340 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[7],auVar24);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_120 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[5],auVar34);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_140 = vpsrad_avx2(auVar3,auVar74);
  auVar35._4_4_ = iVar2;
  auVar35._0_4_ = iVar2;
  auVar35._8_4_ = iVar2;
  auVar35._12_4_ = iVar2;
  auVar35._16_4_ = iVar2;
  auVar35._20_4_ = iVar2;
  auVar35._24_4_ = iVar2;
  auVar35._28_4_ = iVar2;
  auVar3 = vpmulld_avx2((undefined1  [32])in[5],auVar65);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_320 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xb],auVar56);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_2c0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xb],auVar67);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_1a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[3],auVar35);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x16c);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar4 = vpmulld_avx2((undefined1  [32])in[3],auVar40);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_240 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(auVar4,auVar23);
  local_220 = vpsrad_avx2(auVar3,auVar74);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x194);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xd],auVar25);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar74 = ZEXT416((uint)bit);
  local_1c0 = vpsrad_avx2(auVar3,auVar74);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x22c);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xd],auVar26);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_2a0 = vpsrad_avx2(auVar3,auVar74);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x168);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[2],auVar27);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 600);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar4 = vpmulld_avx2((undefined1  [32])in[2],auVar41);
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x228);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar12 + 0x248);
  auVar42._4_4_ = iVar17;
  auVar42._0_4_ = iVar17;
  auVar42._8_4_ = iVar17;
  auVar42._12_4_ = iVar17;
  auVar42._16_4_ = iVar17;
  auVar42._20_4_ = iVar17;
  auVar42._24_4_ = iVar17;
  auVar42._28_4_ = iVar17;
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_440 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(auVar4,auVar23);
  local_620 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xe],auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_5c0 = vpsrad_avx2(auVar3,auVar74);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x198);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xe],auVar36);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_4a0 = vpsrad_avx2(auVar3,auVar74);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x188);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[10],auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x238);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar4 = vpmulld_avx2((undefined1  [32])in[10],auVar43);
  auVar44._4_4_ = iVar15;
  auVar44._0_4_ = iVar15;
  auVar44._8_4_ = iVar15;
  auVar44._12_4_ = iVar15;
  auVar44._16_4_ = iVar15;
  auVar44._20_4_ = iVar15;
  auVar44._24_4_ = iVar15;
  auVar44._28_4_ = iVar15;
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_4c0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(auVar4,auVar23);
  local_5a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[6],auVar44);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x178);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar4 = vpmulld_avx2((undefined1  [32])in[6],auVar45);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_540 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(auVar4,auVar23);
  local_520 = vpsrad_avx2(auVar3,auVar74);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x170);
  auVar53._4_4_ = iVar17;
  auVar53._0_4_ = iVar17;
  auVar53._8_4_ = iVar17;
  auVar53._12_4_ = iVar17;
  auVar53._16_4_ = iVar17;
  auVar53._20_4_ = iVar17;
  auVar53._24_4_ = iVar17;
  auVar53._28_4_ = iVar17;
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar12 + 400);
  auVar73._4_4_ = iVar15;
  auVar73._0_4_ = iVar15;
  auVar73._8_4_ = iVar15;
  auVar73._12_4_ = iVar15;
  auVar73._16_4_ = iVar15;
  auVar73._20_4_ = iVar15;
  auVar73._24_4_ = iVar15;
  auVar73._28_4_ = iVar15;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x230);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x250);
  auVar71._4_4_ = iVar14;
  auVar71._0_4_ = iVar14;
  auVar71._8_4_ = iVar14;
  auVar71._12_4_ = iVar14;
  auVar71._16_4_ = iVar14;
  auVar71._20_4_ = iVar14;
  auVar71._24_4_ = iVar14;
  auVar71._28_4_ = iVar14;
  iVar19 = -iVar2;
  auVar29._4_4_ = iVar19;
  auVar29._0_4_ = iVar19;
  auVar29._8_4_ = iVar19;
  auVar29._12_4_ = iVar19;
  auVar29._16_4_ = iVar19;
  auVar29._20_4_ = iVar19;
  auVar29._24_4_ = iVar19;
  auVar29._28_4_ = iVar19;
  auVar3 = vpmulld_avx2((undefined1  [32])in[4],auVar53);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_640 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[4],auVar71);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_720 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xc],auVar29);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_6c0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xc],auVar73);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_6a0 = vpsrad_avx2(auVar3,auVar74);
  iVar17 = -iVar17;
  auVar46._4_4_ = iVar17;
  auVar46._0_4_ = iVar17;
  auVar46._8_4_ = iVar17;
  auVar46._12_4_ = iVar17;
  auVar46._16_4_ = iVar17;
  auVar46._20_4_ = iVar17;
  auVar46._24_4_ = iVar17;
  auVar46._28_4_ = iVar17;
  auVar3 = vpmulld_avx2(local_420,auVar46);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar4 = vpmulld_avx2(local_40,auVar71);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  iVar14 = -iVar14;
  auVar57._4_4_ = iVar14;
  auVar57._0_4_ = iVar14;
  auVar57._8_4_ = iVar14;
  auVar57._12_4_ = iVar14;
  auVar57._16_4_ = iVar14;
  auVar57._20_4_ = iVar14;
  auVar57._24_4_ = iVar14;
  auVar57._28_4_ = iVar14;
  auVar4 = vpmulld_avx2(local_3c0,auVar57);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar20 = vpmulld_avx2(local_a0,auVar46);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1d0);
  auVar66._4_4_ = iVar17;
  auVar66._0_4_ = iVar17;
  auVar66._8_4_ = iVar17;
  auVar66._12_4_ = iVar17;
  auVar66._16_4_ = iVar17;
  auVar66._20_4_ = iVar17;
  auVar66._24_4_ = iVar17;
  auVar66._28_4_ = iVar17;
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1f0);
  iVar19 = -iVar14;
  auVar30._4_4_ = iVar19;
  auVar30._0_4_ = iVar19;
  auVar30._8_4_ = iVar19;
  auVar30._12_4_ = iVar19;
  auVar30._16_4_ = iVar19;
  auVar30._20_4_ = iVar19;
  auVar30._24_4_ = iVar19;
  auVar30._28_4_ = iVar19;
  auVar20 = vpmulld_avx2(local_3a0,auVar30);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar24 = vpmulld_avx2(local_c0,auVar66);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  iVar17 = -iVar17;
  auVar68._4_4_ = iVar17;
  auVar68._0_4_ = iVar17;
  auVar68._8_4_ = iVar17;
  auVar68._12_4_ = iVar17;
  auVar68._16_4_ = iVar17;
  auVar68._20_4_ = iVar17;
  auVar68._24_4_ = iVar17;
  auVar68._28_4_ = iVar17;
  auVar24 = vpmulld_avx2(local_340,auVar68);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_120,auVar30);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpmulld_avx2(local_340,auVar30);
  auVar26 = vpmulld_avx2(local_120,auVar66);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  local_100 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_3a0,auVar66);
  auVar31._4_4_ = iVar14;
  auVar31._0_4_ = iVar14;
  auVar31._8_4_ = iVar14;
  auVar31._12_4_ = iVar14;
  auVar31._16_4_ = iVar14;
  auVar31._20_4_ = iVar14;
  auVar31._24_4_ = iVar14;
  auVar31._28_4_ = iVar14;
  auVar26 = vpmulld_avx2(local_c0,auVar31);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_e0 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_3c0,auVar46);
  auVar26 = vpmulld_avx2(auVar71,local_a0);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  auVar74 = ZEXT416((uint)bit);
  local_80 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_420,auVar71);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1b0);
  auVar26 = vpmulld_avx2(local_40,auVar53);
  iVar19 = -iVar17;
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x210);
  local_60 = vpsrad_avx2(auVar25,auVar74);
  auVar51._4_4_ = iVar14;
  auVar51._0_4_ = iVar14;
  auVar51._8_4_ = iVar14;
  auVar51._12_4_ = iVar14;
  auVar51._16_4_ = iVar14;
  auVar51._20_4_ = iVar14;
  auVar51._24_4_ = iVar14;
  auVar51._28_4_ = iVar14;
  auVar62._4_4_ = iVar19;
  auVar62._0_4_ = iVar19;
  auVar62._8_4_ = iVar19;
  auVar62._12_4_ = iVar19;
  auVar62._16_4_ = iVar19;
  auVar62._20_4_ = iVar19;
  auVar62._24_4_ = iVar19;
  auVar62._28_4_ = iVar19;
  local_400 = vpsrad_avx2(auVar3,auVar74);
  local_3e0 = vpsrad_avx2(auVar4,auVar74);
  local_380 = vpsrad_avx2(auVar20,auVar74);
  iVar14 = -iVar14;
  local_360 = vpsrad_avx2(auVar24,auVar74);
  auVar4 = vpmulld_avx2(local_320,auVar62);
  auVar3 = vpmulld_avx2(local_140,auVar51);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar20._4_4_ = iVar14;
  auVar20._0_4_ = iVar14;
  auVar20._8_4_ = iVar14;
  auVar20._12_4_ = iVar14;
  auVar20._16_4_ = iVar14;
  auVar20._20_4_ = iVar14;
  auVar20._24_4_ = iVar14;
  auVar20._28_4_ = iVar14;
  auVar4 = vpmulld_avx2(local_2c0,auVar20);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar20 = vpmulld_avx2(local_1a0,auVar62);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_1c0,auVar73);
  auVar20 = vpaddd_avx2(auVar23,auVar20);
  auVar24 = vpmulld_avx2(local_2a0,auVar29);
  auVar20 = vpaddd_avx2(auVar24,auVar20);
  iVar15 = -iVar15;
  auVar32._4_4_ = iVar15;
  auVar32._0_4_ = iVar15;
  auVar32._8_4_ = iVar15;
  auVar32._12_4_ = iVar15;
  auVar32._16_4_ = iVar15;
  auVar32._20_4_ = iVar15;
  auVar32._24_4_ = iVar15;
  auVar32._28_4_ = iVar15;
  auVar24 = vpmulld_avx2(local_240,auVar32);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_220,auVar29);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar26 = vpmulld_avx2(local_240,auVar29);
  auVar25 = vpmulld_avx2(local_220,auVar73);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  local_200 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_2a0,auVar73);
  auVar58._4_4_ = iVar2;
  auVar58._0_4_ = iVar2;
  auVar58._8_4_ = iVar2;
  auVar58._12_4_ = iVar2;
  auVar58._16_4_ = iVar2;
  auVar58._20_4_ = iVar2;
  auVar58._24_4_ = iVar2;
  auVar58._28_4_ = iVar2;
  auVar26 = vpmulld_avx2(local_1c0,auVar58);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_1e0 = vpsrad_avx2(auVar25,auVar74);
  auVar26 = vpmulld_avx2(local_2c0,auVar62);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x180);
  auVar25 = vpmulld_avx2(local_1a0,auVar51);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  auVar54._4_4_ = iVar15;
  auVar54._0_4_ = iVar15;
  auVar54._8_4_ = iVar15;
  auVar54._12_4_ = iVar15;
  auVar54._16_4_ = iVar15;
  auVar54._20_4_ = iVar15;
  auVar54._24_4_ = iVar15;
  auVar54._28_4_ = iVar15;
  auVar37._4_4_ = iVar17;
  auVar37._0_4_ = iVar17;
  auVar37._8_4_ = iVar17;
  auVar37._12_4_ = iVar17;
  auVar37._16_4_ = iVar17;
  auVar37._20_4_ = iVar17;
  auVar37._24_4_ = iVar17;
  auVar37._28_4_ = iVar17;
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1c0);
  local_180 = vpsrad_avx2(auVar25,auVar74);
  auVar63._4_4_ = iVar17;
  auVar63._0_4_ = iVar17;
  auVar63._8_4_ = iVar17;
  auVar63._12_4_ = iVar17;
  auVar63._16_4_ = iVar17;
  auVar63._20_4_ = iVar17;
  auVar63._24_4_ = iVar17;
  auVar63._28_4_ = iVar17;
  iVar15 = -iVar15;
  auVar25 = vpmulld_avx2(auVar51,local_320);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x200);
  auVar26 = vpmulld_avx2(local_140,auVar37);
  iVar19 = -iVar2;
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x240);
  local_160 = vpsrad_avx2(auVar25,auVar74);
  auVar70._4_4_ = iVar14;
  auVar70._0_4_ = iVar14;
  auVar70._8_4_ = iVar14;
  auVar70._12_4_ = iVar14;
  auVar70._16_4_ = iVar14;
  auVar70._20_4_ = iVar14;
  auVar70._24_4_ = iVar14;
  auVar70._28_4_ = iVar14;
  auVar72._4_4_ = iVar15;
  auVar72._0_4_ = iVar15;
  auVar72._8_4_ = iVar15;
  auVar72._12_4_ = iVar15;
  auVar72._16_4_ = iVar15;
  auVar72._20_4_ = iVar15;
  auVar72._24_4_ = iVar15;
  auVar72._28_4_ = iVar15;
  auVar59._4_4_ = iVar19;
  auVar59._0_4_ = iVar19;
  auVar59._8_4_ = iVar19;
  auVar59._12_4_ = iVar19;
  auVar59._16_4_ = iVar19;
  auVar59._20_4_ = iVar19;
  auVar59._24_4_ = iVar19;
  auVar59._28_4_ = iVar19;
  iVar14 = -iVar14;
  local_300 = vpsrad_avx2(auVar3,auVar74);
  local_2e0 = vpsrad_avx2(auVar4,auVar74);
  local_280 = vpsrad_avx2(auVar20,auVar74);
  auVar47._4_4_ = iVar14;
  auVar47._0_4_ = iVar14;
  auVar47._8_4_ = iVar14;
  auVar47._12_4_ = iVar14;
  auVar47._16_4_ = iVar14;
  auVar47._20_4_ = iVar14;
  auVar47._24_4_ = iVar14;
  auVar47._28_4_ = iVar14;
  local_260 = vpsrad_avx2(auVar24,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[8],auVar54);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_740 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2((undefined1  [32])in[8],auVar70);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_7a0 = vpsrad_avx2(auVar3,auVar74);
  local_700 = local_720;
  local_6e0 = local_6c0;
  local_680 = local_6a0;
  local_660 = local_640;
  auVar4 = vpmulld_avx2(local_620,auVar72);
  auVar3 = vpmulld_avx2(local_440,auVar70);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar4 = vpmulld_avx2(local_5c0,auVar47);
  auVar20 = vpmulld_avx2(local_4a0,auVar72);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_4c0,auVar63);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar24 = vpmulld_avx2(local_5a0,auVar59);
  auVar20 = vpaddd_avx2(auVar24,auVar20);
  iVar17 = -iVar17;
  local_880._4_4_ = iVar17;
  local_880._0_4_ = iVar17;
  local_880._8_4_ = iVar17;
  local_880._12_4_ = iVar17;
  local_880._16_4_ = iVar17;
  local_880._20_4_ = iVar17;
  local_880._24_4_ = iVar17;
  local_880._28_4_ = iVar17;
  auVar24 = vpmulld_avx2(local_540,local_880);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_520,auVar59);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar26 = vpmulld_avx2(local_540,auVar59);
  auVar25 = vpmulld_avx2(local_520,auVar63);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_500 = vpsrad_avx2(auVar25,auVar74);
  auVar60._4_4_ = iVar2;
  auVar60._0_4_ = iVar2;
  auVar60._8_4_ = iVar2;
  auVar60._12_4_ = iVar2;
  auVar60._16_4_ = iVar2;
  auVar60._20_4_ = iVar2;
  auVar60._24_4_ = iVar2;
  auVar60._28_4_ = iVar2;
  auVar25 = vpmulld_avx2(local_5a0,auVar63);
  auVar26 = vpmulld_avx2(local_4c0,auVar60);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  auVar27 = vpmulld_avx2(local_5c0,auVar72);
  auVar26 = vpmulld_avx2(local_4a0,auVar70);
  auVar26 = vpaddd_avx2(auVar23,auVar26);
  auVar26 = vpaddd_avx2(auVar27,auVar26);
  local_4e0 = vpsrad_avx2(auVar25,auVar74);
  local_480 = vpsrad_avx2(auVar26,auVar74);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1a0);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1e0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x220);
  auVar25 = vpmulld_avx2(auVar70,local_620);
  auVar26 = vpmulld_avx2(local_440,auVar54);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_600 = vpsrad_avx2(auVar3,auVar74);
  iVar19 = -iVar17;
  local_460 = vpsrad_avx2(auVar25,auVar74);
  uVar18 = -iVar15;
  local_5e0 = vpsrad_avx2(auVar4,auVar74);
  local_8a0 = ZEXT432(uVar18);
  local_580 = vpsrad_avx2(auVar20,auVar74);
  iVar14 = -iVar2;
  local_560 = vpsrad_avx2(auVar24,auVar74);
  uVar13 = 0x18;
  auVar4._4_4_ = local_8c0;
  auVar4._0_4_ = local_8c0;
  auVar4._8_4_ = local_8c0;
  auVar4._12_4_ = local_8c0;
  auVar4._16_4_ = local_8c0;
  auVar4._20_4_ = local_8c0;
  auVar4._24_4_ = local_8c0;
  auVar4._28_4_ = local_8c0;
  auVar3._4_4_ = local_8e0;
  auVar3._0_4_ = local_8e0;
  auVar3._8_4_ = local_8e0;
  auVar3._12_4_ = local_8e0;
  auVar3._16_4_ = local_8e0;
  auVar3._20_4_ = local_8e0;
  auVar3._24_4_ = local_8e0;
  auVar3._28_4_ = local_8e0;
  do {
    auVar20 = vpaddd_avx2(pauVar11[-4],pauVar11[-7]);
    auVar25 = vpsubd_avx2(pauVar11[-7],pauVar11[-4]);
    auVar20 = vpmaxsd_avx2(auVar20,auVar4);
    auVar24 = vpminsd_avx2(auVar20,auVar3);
    auVar20 = vpmaxsd_avx2(auVar25,auVar4);
    auVar20 = vpminsd_avx2(auVar20,auVar3);
    pauVar11[-7] = auVar24;
    pauVar11[-4] = auVar20;
    auVar20 = vpaddd_avx2(pauVar11[-5],pauVar11[-6]);
    auVar25 = vpsubd_avx2(pauVar11[-6],pauVar11[-5]);
    auVar20 = vpmaxsd_avx2(auVar20,auVar4);
    auVar24 = vpminsd_avx2(auVar20,auVar3);
    auVar20 = vpmaxsd_avx2(auVar25,auVar4);
    auVar20 = vpminsd_avx2(auVar20,auVar3);
    pauVar11[-6] = auVar24;
    pauVar11[-5] = auVar20;
    auVar20 = vpaddd_avx2(pauVar11[-3],*pauVar11);
    auVar25 = vpsubd_avx2(*pauVar11,pauVar11[-3]);
    auVar20 = vpmaxsd_avx2(auVar20,auVar4);
    auVar24 = vpminsd_avx2(auVar20,auVar3);
    auVar20 = vpmaxsd_avx2(auVar25,auVar4);
    auVar20 = vpminsd_avx2(auVar20,auVar3);
    *pauVar11 = auVar24;
    pauVar11[-3] = auVar20;
    auVar20 = vpaddd_avx2(pauVar11[-2],pauVar11[-1]);
    auVar25 = vpsubd_avx2(pauVar11[-1],pauVar11[-2]);
    auVar20 = vpmaxsd_avx2(auVar20,auVar4);
    auVar24 = vpminsd_avx2(auVar20,auVar3);
    auVar20 = vpmaxsd_avx2(auVar25,auVar4);
    auVar20 = vpminsd_avx2(auVar20,auVar3);
    pauVar11[-1] = auVar24;
    pauVar11[-2] = auVar20;
    uVar13 = uVar13 + 8;
    pauVar11 = pauVar11 + 8;
  } while (uVar13 < 0x38);
  auVar69._4_4_ = iVar17;
  auVar69._0_4_ = iVar17;
  auVar69._8_4_ = iVar17;
  auVar69._12_4_ = iVar17;
  auVar69._16_4_ = iVar17;
  auVar69._20_4_ = iVar17;
  auVar69._24_4_ = iVar17;
  auVar69._28_4_ = iVar17;
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  pauVar11 = &local_540;
  auVar3 = vpmulld_avx2(auVar21,(undefined1  [32])alVar9);
  auVar33._4_4_ = iVar2;
  auVar33._0_4_ = iVar2;
  auVar33._8_4_ = iVar2;
  auVar33._12_4_ = iVar2;
  auVar33._16_4_ = iVar2;
  auVar33._20_4_ = iVar2;
  auVar33._24_4_ = iVar2;
  auVar33._28_4_ = iVar2;
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  local_840 = (__m256i)vpsrad_avx2(auVar3,auVar74);
  auVar22._4_4_ = iVar19;
  auVar22._0_4_ = iVar19;
  auVar22._8_4_ = iVar19;
  auVar22._12_4_ = iVar19;
  auVar22._16_4_ = iVar19;
  auVar22._20_4_ = iVar19;
  auVar22._24_4_ = iVar19;
  auVar22._28_4_ = iVar19;
  local_800[0] = local_840[0];
  local_800[1] = local_840[1];
  local_800[2] = local_840[2];
  local_800[3] = local_840[3];
  local_820[0] = local_840[0];
  local_820[1] = local_840[1];
  local_820[2] = local_840[2];
  local_820[3] = local_840[3];
  local_780 = local_7a0;
  local_760 = local_740;
  auVar3 = vpmulld_avx2(local_720,auVar22);
  auVar4 = vpmulld_avx2(local_640,auVar33);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_700 = vpsrad_avx2(auVar3,auVar74);
  auVar48._4_4_ = iVar14;
  auVar48._0_4_ = iVar14;
  auVar48._8_4_ = iVar14;
  auVar48._12_4_ = iVar14;
  auVar48._16_4_ = iVar14;
  auVar48._20_4_ = iVar14;
  auVar48._24_4_ = iVar14;
  auVar48._28_4_ = iVar14;
  auVar3 = vpmulld_avx2(local_720,auVar33);
  auVar4 = vpmulld_avx2(local_640,auVar69);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_660 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_6c0,auVar48);
  auVar4 = vpmulld_avx2(local_6a0,auVar22);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_6e0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_6c0,auVar22);
  auVar4 = vpmulld_avx2(local_6a0,auVar33);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_680 = vpsrad_avx2(auVar3,auVar74);
  auVar7._4_4_ = local_8c0;
  auVar7._0_4_ = local_8c0;
  auVar7._8_4_ = local_8c0;
  auVar7._12_4_ = local_8c0;
  auVar7._16_4_ = local_8c0;
  auVar7._20_4_ = local_8c0;
  auVar7._24_4_ = local_8c0;
  auVar7._28_4_ = local_8c0;
  auVar5._4_4_ = local_8e0;
  auVar5._0_4_ = local_8e0;
  auVar5._8_4_ = local_8e0;
  auVar5._12_4_ = local_8e0;
  auVar5._16_4_ = local_8e0;
  auVar5._20_4_ = local_8e0;
  auVar5._24_4_ = local_8e0;
  auVar5._28_4_ = local_8e0;
  uVar13 = 8;
  do {
    auVar3 = vpaddd_avx2(pauVar11[-4],pauVar11[-7]);
    auVar20 = vpsubd_avx2(pauVar11[-7],pauVar11[-4]);
    auVar3 = vpmaxsd_avx2(auVar3,auVar7);
    auVar4 = vpminsd_avx2(auVar3,auVar5);
    auVar3 = vpmaxsd_avx2(auVar20,auVar7);
    auVar3 = vpminsd_avx2(auVar3,auVar5);
    pauVar11[-7] = auVar4;
    pauVar11[-4] = auVar3;
    auVar3 = vpaddd_avx2(pauVar11[-5],pauVar11[-6]);
    auVar20 = vpsubd_avx2(pauVar11[-6],pauVar11[-5]);
    auVar3 = vpmaxsd_avx2(auVar3,auVar7);
    auVar4 = vpminsd_avx2(auVar3,auVar5);
    auVar3 = vpmaxsd_avx2(auVar20,auVar7);
    auVar3 = vpminsd_avx2(auVar3,auVar5);
    pauVar11[-6] = auVar4;
    pauVar11[-5] = auVar3;
    auVar3 = vpaddd_avx2(pauVar11[-3],*pauVar11);
    auVar20 = vpsubd_avx2(*pauVar11,pauVar11[-3]);
    auVar3 = vpmaxsd_avx2(auVar3,auVar7);
    auVar4 = vpminsd_avx2(auVar3,auVar5);
    auVar3 = vpmaxsd_avx2(auVar20,auVar7);
    auVar3 = vpminsd_avx2(auVar3,auVar5);
    *pauVar11 = auVar4;
    pauVar11[-3] = auVar3;
    auVar3 = vpaddd_avx2(pauVar11[-2],pauVar11[-1]);
    auVar20 = vpsubd_avx2(pauVar11[-1],pauVar11[-2]);
    auVar3 = vpmaxsd_avx2(auVar3,auVar7);
    auVar4 = vpminsd_avx2(auVar3,auVar5);
    auVar3 = vpmaxsd_avx2(auVar20,auVar7);
    auVar3 = vpminsd_avx2(auVar3,auVar5);
    pauVar11[-1] = auVar4;
    pauVar11[-2] = auVar3;
    uVar13 = uVar13 + 8;
    pauVar11 = pauVar11 + 8;
  } while (uVar13 < 0x18);
  puVar10 = local_420;
  auVar3 = vpmulld_avx2(local_3e0,auVar72);
  auVar4 = vpmulld_avx2(local_80,auVar70);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_860 = vpaddd_avx2(auVar3,auVar4);
  auVar3 = vpmulld_avx2(local_3c0,auVar72);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar4 = vpmulld_avx2(local_a0,auVar70);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar4 = vpmulld_avx2(local_3a0,auVar47);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar20 = vpmulld_avx2(local_c0,auVar72);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_380,auVar47);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar24 = vpmulld_avx2(local_e0,auVar72);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  auVar24 = vpmulld_avx2(local_380,auVar72);
  auVar25 = vpmulld_avx2(local_e0,auVar70);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  local_e0 = vpsrad_avx2(auVar24,auVar74);
  auVar24 = vpmulld_avx2(local_3a0,auVar72);
  auVar25 = vpmulld_avx2(local_c0,auVar70);
  auVar24 = vpaddd_avx2(auVar23,auVar24);
  auVar24 = vpaddd_avx2(auVar25,auVar24);
  local_c0 = vpsrad_avx2(auVar24,auVar74);
  auVar24 = vpsrad_avx2(local_860,auVar74);
  auVar25 = vpsrad_avx2(auVar3,auVar74);
  local_3a0 = vpsrad_avx2(auVar4,auVar74);
  local_380 = vpsrad_avx2(auVar20,auVar74);
  auVar3 = vpmulld_avx2(local_3c0,auVar70);
  auVar4 = vpmulld_avx2(local_a0,auVar54);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_3e0,auVar70);
  auVar4 = vpmulld_avx2(local_80,auVar54);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_80 = vpsrad_avx2(auVar3,auVar74);
  local_3e0 = auVar24;
  local_3c0 = auVar25;
  auVar3 = vpmulld_avx2(local_2e0,auVar59);
  auVar4 = vpmulld_avx2(local_180,auVar63);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_2c0,auVar59);
  auVar20 = vpmulld_avx2(local_1a0,auVar63);
  auVar4 = vpaddd_avx2(auVar23,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_2a0,local_880);
  auVar24 = vpmulld_avx2(local_1c0,auVar59);
  auVar20 = vpaddd_avx2(auVar23,auVar20);
  auVar20 = vpaddd_avx2(auVar24,auVar20);
  auVar24 = vpmulld_avx2(local_280,local_880);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_1e0,auVar59);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpmulld_avx2(local_280,auVar59);
  auVar26 = vpmulld_avx2(local_1e0,auVar63);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  auVar26 = vpsrad_avx2(auVar3,auVar74);
  auVar27 = vpsrad_avx2(auVar4,auVar74);
  auVar20 = vpsrad_avx2(auVar20,auVar74);
  local_280 = vpsrad_avx2(auVar24,auVar74);
  local_1e0 = vpsrad_avx2(auVar25,auVar74);
  auVar38._4_4_ = uVar18;
  auVar38._0_4_ = uVar18;
  auVar38._8_4_ = uVar18;
  auVar38._12_4_ = uVar18;
  auVar38._16_4_ = uVar18;
  auVar38._20_4_ = uVar18;
  auVar38._24_4_ = uVar18;
  auVar38._28_4_ = uVar18;
  auVar3 = vpmulld_avx2(local_2a0,auVar59);
  auVar4 = vpmulld_avx2(local_1c0,auVar63);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_1c0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_2c0,auVar63);
  auVar4 = vpmulld_avx2(local_1a0,auVar60);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_1a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_2e0,auVar63);
  auVar4 = vpmulld_avx2(local_180,auVar60);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_180 = vpsrad_avx2(auVar3,auVar74);
  local_2e0 = auVar26;
  local_2c0 = auVar27;
  local_2a0 = auVar20;
  local_7c0 = local_840[0];
  lStack_7b8 = local_840[1];
  lStack_7b0 = local_840[2];
  lStack_7a8 = local_840[3];
  local_7e0 = local_840[0];
  lStack_7d8 = local_840[1];
  lStack_7d0 = local_840[2];
  lStack_7c8 = local_840[3];
  auVar3 = vpmulld_avx2(local_7a0,auVar38);
  auVar4 = vpmulld_avx2(local_740,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  local_780 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_740,local_7a0);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_760 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_6c0,local_720);
  auVar4 = vpsubd_avx2(local_720,local_6c0);
  auVar8._4_4_ = local_8c0;
  auVar8._0_4_ = local_8c0;
  auVar8._8_4_ = local_8c0;
  auVar8._12_4_ = local_8c0;
  auVar8._16_4_ = local_8c0;
  auVar8._20_4_ = local_8c0;
  auVar8._24_4_ = local_8c0;
  auVar8._28_4_ = local_8c0;
  auVar3 = vpmaxsd_avx2(auVar3,auVar8);
  auVar6._4_4_ = local_8e0;
  auVar6._0_4_ = local_8e0;
  auVar6._8_4_ = local_8e0;
  auVar6._12_4_ = local_8e0;
  auVar6._16_4_ = local_8e0;
  auVar6._20_4_ = local_8e0;
  auVar6._24_4_ = local_8e0;
  auVar6._28_4_ = local_8e0;
  local_720 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpmaxsd_avx2(auVar4,auVar8);
  local_6c0 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpaddd_avx2(local_6e0,local_700);
  auVar4 = vpsubd_avx2(local_700,local_6e0);
  auVar3 = vpmaxsd_avx2(auVar3,auVar8);
  local_700 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpmaxsd_avx2(auVar4,auVar8);
  local_6e0 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpaddd_avx2(local_6a0,local_640);
  auVar4 = vpsubd_avx2(local_640,local_6a0);
  auVar3 = vpmaxsd_avx2(auVar3,auVar8);
  local_640 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpmaxsd_avx2(auVar4,auVar8);
  local_6a0 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpaddd_avx2(local_680,local_660);
  auVar4 = vpsubd_avx2(local_660,local_680);
  auVar3 = vpmaxsd_avx2(auVar3,auVar8);
  local_660 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpmaxsd_avx2(auVar4,auVar8);
  local_680 = vpminsd_avx2(auVar3,auVar6);
  auVar3 = vpmulld_avx2(local_5e0,auVar22);
  auVar4 = vpmulld_avx2(local_480,auVar33);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_5c0,auVar22);
  auVar20 = vpmulld_avx2(local_4a0,auVar33);
  auVar4 = vpaddd_avx2(auVar23,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_5a0,auVar48);
  auVar24 = vpmulld_avx2(local_4c0,auVar22);
  auVar20 = vpaddd_avx2(auVar23,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  auVar24 = vpmulld_avx2(local_580,auVar22);
  auVar25 = vpmulld_avx2(local_4e0,auVar33);
  auVar24 = vpaddd_avx2(auVar23,auVar24);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpmulld_avx2(local_580,auVar48);
  auVar26 = vpmulld_avx2(local_4e0,auVar22);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_4e0 = vpsrad_avx2(auVar24,auVar74);
  auVar24 = vpaddd_avx2(auVar25,auVar26);
  auVar25 = vpmulld_avx2(local_5a0,auVar22);
  auVar26 = vpmulld_avx2(local_4c0,auVar33);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_4c0 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_5c0,auVar33);
  auVar26 = vpmulld_avx2(local_4a0,auVar69);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_4a0 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(auVar33,local_5e0);
  auVar26 = vpmulld_avx2(local_480,auVar69);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_5e0 = vpsrad_avx2(auVar3,auVar74);
  local_480 = vpsrad_avx2(auVar25,auVar74);
  local_5c0 = vpsrad_avx2(auVar4,auVar74);
  local_5a0 = vpsrad_avx2(auVar20,auVar74);
  local_580 = vpsrad_avx2(auVar24,auVar74);
  uVar13 = 0x20;
  do {
    lVar12 = 0;
    uVar16 = uVar13;
    do {
      auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(local_820 + (uVar16 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar10 + lVar12));
      auVar20 = vpsubd_avx2(*(undefined1 (*) [32])(puVar10 + lVar12),
                            *(undefined1 (*) [32])(local_820 + (uVar16 ^ 7) * 4));
      auVar3 = vpmaxsd_avx2(auVar3,auVar8);
      auVar4 = vpminsd_avx2(auVar3,auVar6);
      auVar3 = vpmaxsd_avx2(auVar20,auVar8);
      auVar3 = vpminsd_avx2(auVar3,auVar6);
      *(undefined1 (*) [32])(puVar10 + lVar12) = auVar4;
      *(undefined1 (*) [32])(local_820 + (uVar16 ^ 7) * 4) = auVar3;
      auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(local_820 + (uVar16 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_820 + (uVar16 ^ 0xf) * 4));
      auVar20 = vpsubd_avx2(*(undefined1 (*) [32])(local_820 + (uVar16 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_820 + (uVar16 ^ 8) * 4));
      auVar3 = vpmaxsd_avx2(auVar3,auVar8);
      auVar4 = vpminsd_avx2(auVar3,auVar6);
      auVar3 = vpmaxsd_avx2(auVar20,auVar8);
      auVar3 = vpminsd_avx2(auVar3,auVar6);
      *(undefined1 (*) [32])(local_820 + (uVar16 ^ 0xf) * 4) = auVar4;
      *(undefined1 (*) [32])(local_820 + (uVar16 ^ 8) * 4) = auVar3;
      uVar16 = uVar16 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x80);
    puVar10 = puVar10 + 0x200;
    uVar18 = (uint)uVar13;
    uVar13 = uVar13 + 0x10;
  } while (uVar18 < 0x30);
  pauVar11 = &local_740;
  lVar12 = 0;
  do {
    auVar3 = vpaddd_avx2(*pauVar11,*(undefined1 (*) [32])((long)local_820 + lVar12));
    auVar20 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_820 + lVar12),*pauVar11);
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])((long)local_820 + lVar12) = auVar4;
    *pauVar11 = auVar3;
    pauVar11 = pauVar11 + -1;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x80);
  pauVar11 = &local_620;
  auVar3 = vpmulld_avx2(local_6e0,auVar38);
  auVar4 = vpmulld_avx2(local_680,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar20 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_680,local_6e0);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_680 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_6c0,auVar38);
  auVar4 = vpmulld_avx2(local_6a0,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_6a0,local_6c0);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_6a0 = vpsrad_avx2(auVar3,auVar74);
  local_6e0 = auVar20;
  local_6c0 = auVar4;
  uVar13 = 0x10;
  do {
    auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(local_820 + (uVar13 ^ 7) * 4),*pauVar11);
    auVar20 = vpsubd_avx2(*pauVar11,*(undefined1 (*) [32])(local_820 + (uVar13 ^ 7) * 4));
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *pauVar11 = auVar4;
    *(undefined1 (*) [32])(local_820 + (uVar13 ^ 7) * 4) = auVar3;
    auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(local_820 + (uVar13 ^ 8) * 4),
                         *(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4));
    auVar20 = vpsubd_avx2(*(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4),
                          *(undefined1 (*) [32])(local_820 + (uVar13 ^ 8) * 4));
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4) = auVar4;
    *(undefined1 (*) [32])(local_820 + (uVar13 ^ 8) * 4) = auVar3;
    uVar13 = uVar13 + 1;
    pauVar11 = pauVar11 + 1;
  } while (uVar13 != 0x14);
  pauVar11 = &local_640;
  auVar3 = vpmulld_avx2(local_3a0,auVar22);
  auVar4 = vpmulld_avx2(local_c0,auVar33);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_380,auVar22);
  auVar20 = vpmulld_avx2(local_e0,auVar33);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_360,auVar22);
  auVar24 = vpmulld_avx2(local_100,auVar33);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar20 = vpaddd_avx2(auVar24,auVar20);
  auVar24 = vpmulld_avx2(local_340,auVar22);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_120,auVar33);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpmulld_avx2(local_340,auVar33);
  auVar26 = vpmulld_avx2(local_120,auVar69);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  auVar26 = vpsrad_avx2(auVar3,auVar74);
  auVar27 = vpsrad_avx2(auVar4,auVar74);
  auVar20 = vpsrad_avx2(auVar20,auVar74);
  local_340 = vpsrad_avx2(auVar24,auVar74);
  local_120 = vpsrad_avx2(auVar25,auVar74);
  auVar3 = vpmulld_avx2(local_360,auVar33);
  auVar4 = vpmulld_avx2(local_100,auVar69);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_100 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(auVar33,local_380);
  auVar4 = vpmulld_avx2(local_e0,auVar69);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_e0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(auVar33,local_3a0);
  auVar4 = vpmulld_avx2(auVar69,local_c0);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  local_c0 = vpsrad_avx2(auVar3,auVar74);
  local_3a0 = auVar26;
  local_380 = auVar27;
  local_360 = auVar20;
  auVar3 = vpmulld_avx2(local_320,auVar48);
  auVar4 = vpmulld_avx2(local_140,auVar22);
  auVar3 = vpaddd_avx2(auVar3,auVar23);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_300,auVar48);
  auVar20 = vpmulld_avx2(local_160,auVar22);
  auVar4 = vpaddd_avx2(auVar4,auVar23);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_2e0,auVar48);
  auVar24 = vpmulld_avx2(local_180,auVar22);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  auVar25 = vpmulld_avx2(local_2c0,auVar48);
  auVar24 = vpmulld_avx2(local_2c0,auVar22);
  auVar26 = vpmulld_avx2(local_1a0,auVar33);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar24 = vpaddd_avx2(auVar24,auVar26);
  auVar26 = vpmulld_avx2(local_1a0,auVar22);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  local_1a0 = vpsrad_avx2(auVar24,auVar74);
  auVar24 = vpaddd_avx2(auVar25,auVar26);
  auVar25 = vpmulld_avx2(local_2e0,auVar22);
  auVar26 = vpmulld_avx2(local_180,auVar33);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_180 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_300,auVar22);
  auVar26 = vpmulld_avx2(local_160,auVar33);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_160 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(local_320,auVar22);
  auVar26 = vpmulld_avx2(local_140,auVar33);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  local_320 = vpsrad_avx2(auVar3,auVar74);
  local_140 = vpsrad_avx2(auVar25,auVar74);
  local_300 = vpsrad_avx2(auVar4,auVar74);
  local_2e0 = vpsrad_avx2(auVar20,auVar74);
  local_2c0 = vpsrad_avx2(auVar24,auVar74);
  lVar12 = 0;
  do {
    auVar3 = vpaddd_avx2(*pauVar11,*(undefined1 (*) [32])((long)local_820 + lVar12));
    auVar20 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_820 + lVar12),*pauVar11);
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])((long)local_820 + lVar12) = auVar4;
    *pauVar11 = auVar3;
    lVar12 = lVar12 + 0x20;
    pauVar11 = pauVar11 + -1;
  } while (lVar12 != 0x100);
  pauVar11 = &local_420;
  auVar3 = vpmulld_avx2(local_5a0,auVar38);
  auVar4 = vpmulld_avx2(local_4c0,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_580,auVar38);
  auVar20 = vpmulld_avx2(local_4e0,auVar21);
  auVar4 = vpaddd_avx2(auVar23,auVar4);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpmulld_avx2(local_560,auVar38);
  auVar24 = vpmulld_avx2(local_500,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  auVar24 = vpmulld_avx2(local_540,auVar38);
  auVar25 = vpmulld_avx2(local_520,auVar21);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpaddd_avx2(local_520,local_540);
  auVar25 = vpmulld_avx2(auVar25,auVar21);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_520 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpaddd_avx2(local_500,local_560);
  auVar25 = vpmulld_avx2(auVar25,auVar21);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_500 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpaddd_avx2(local_4e0,local_580);
  auVar25 = vpmulld_avx2(auVar25,auVar21);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_4e0 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpaddd_avx2(local_4c0,local_5a0);
  local_5a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(auVar25,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_4c0 = vpsrad_avx2(auVar3,auVar74);
  local_580 = vpsrad_avx2(auVar4,auVar74);
  local_560 = vpsrad_avx2(auVar20,auVar74);
  local_540 = vpsrad_avx2(auVar24,auVar74);
  uVar13 = 0x20;
  do {
    auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4),*pauVar11);
    auVar20 = vpsubd_avx2(*pauVar11,*(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4));
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *pauVar11 = auVar4;
    *(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4) = auVar3;
    uVar13 = uVar13 + 1;
    pauVar11 = pauVar11 + 1;
  } while (uVar13 != 0x28);
  uVar13 = 0x30;
  pauVar11 = &local_220;
  do {
    auVar3 = vpaddd_avx2(*pauVar11,*(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4));
    auVar20 = vpsubd_avx2(*(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4),*pauVar11);
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])(local_820 + (uVar13 ^ 0xf) * 4) = auVar4;
    *pauVar11 = auVar3;
    uVar13 = uVar13 + 1;
    pauVar11 = pauVar11 + 1;
  } while (uVar13 != 0x38);
  pauVar11 = &local_440;
  lVar12 = 0;
  do {
    auVar3 = vpaddd_avx2(*pauVar11,*(undefined1 (*) [32])((long)local_820 + lVar12));
    auVar20 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_820 + lVar12),*pauVar11);
    auVar3 = vpmaxsd_avx2(auVar3,auVar8);
    auVar4 = vpminsd_avx2(auVar3,auVar6);
    auVar3 = vpmaxsd_avx2(auVar20,auVar8);
    auVar3 = vpminsd_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])((long)local_820 + lVar12) = auVar4;
    *pauVar11 = auVar3;
    lVar12 = lVar12 + 0x20;
    pauVar11 = pauVar11 + -1;
  } while (lVar12 != 0x200);
  auVar3 = vpmulld_avx2(local_320,auVar38);
  auVar4 = vpmulld_avx2(local_140,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_300,auVar38);
  auVar20 = vpmulld_avx2(local_160,auVar21);
  auVar4 = vpaddd_avx2(auVar23,auVar4);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpmulld_avx2(local_2e0,auVar38);
  auVar24 = vpmulld_avx2(local_180,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar20 = vpaddd_avx2(auVar20,auVar24);
  auVar24 = vpmulld_avx2(local_2c0,auVar38);
  auVar24 = vpaddd_avx2(auVar24,auVar23);
  auVar25 = vpmulld_avx2(local_1a0,auVar21);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25 = vpaddd_avx2(local_1a0,local_2c0);
  auVar27 = vpsrad_avx2(auVar3,auVar74);
  auVar28 = vpsrad_avx2(auVar4,auVar74);
  auVar29 = vpsrad_avx2(auVar20,auVar74);
  local_2c0 = vpsrad_avx2(auVar24,auVar74);
  auVar3 = vpmulld_avx2(auVar25,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_1a0 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_180,local_2e0);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_180 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_160,local_300);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_160 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpaddd_avx2(local_140,local_320);
  auVar3 = vpmulld_avx2(auVar3,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  local_140 = vpsrad_avx2(auVar3,auVar74);
  auVar3 = vpmulld_avx2(local_2a0,auVar38);
  auVar4 = vpmulld_avx2(local_1c0,auVar21);
  auVar3 = vpaddd_avx2(auVar23,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(local_280,auVar38);
  auVar20 = vpmulld_avx2(local_1e0,auVar21);
  auVar4 = vpaddd_avx2(auVar23,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpmulld_avx2(local_260,auVar38);
  auVar24 = vpmulld_avx2(local_200,auVar21);
  auVar20 = vpaddd_avx2(auVar23,auVar20);
  auVar20 = vpaddd_avx2(auVar24,auVar20);
  auVar25 = vpmulld_avx2(local_240,auVar38);
  auVar24 = vpaddd_avx2(local_220,local_240);
  auVar26 = vpmulld_avx2(local_220,auVar21);
  auVar25 = vpaddd_avx2(auVar25,auVar23);
  auVar24 = vpmulld_avx2(auVar24,auVar21);
  auVar24 = vpaddd_avx2(auVar23,auVar24);
  local_220 = vpsrad_avx2(auVar24,auVar74);
  auVar24 = vpaddd_avx2(auVar25,auVar26);
  auVar25 = vpaddd_avx2(local_200,local_260);
  auVar26 = vpaddd_avx2(local_280,local_1e0);
  auVar25 = vpmulld_avx2(auVar25,auVar21);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_200 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpmulld_avx2(auVar26,auVar21);
  auVar25 = vpaddd_avx2(auVar23,auVar25);
  local_1e0 = vpsrad_avx2(auVar25,auVar74);
  auVar25 = vpaddd_avx2(local_1c0,local_2a0);
  auVar25 = vpmulld_avx2(auVar25,auVar21);
  local_2a0 = vpsrad_avx2(auVar3,auVar74);
  local_280 = vpsrad_avx2(auVar4,auVar74);
  local_260 = vpsrad_avx2(auVar20,auVar74);
  local_240 = vpsrad_avx2(auVar24,auVar74);
  auVar23 = vpaddd_avx2(auVar23,auVar25);
  local_1c0 = vpsrad_avx2(auVar23,auVar74);
  iStack_8dc = local_8e0;
  iStack_8d8 = local_8e0;
  iStack_8d4 = local_8e0;
  iStack_8d0 = local_8e0;
  iStack_8cc = local_8e0;
  iStack_8c8 = local_8e0;
  iStack_8c4 = local_8e0;
  iStack_8bc = local_8c0;
  iStack_8b8 = local_8c0;
  iStack_8b4 = local_8c0;
  iStack_8b0 = local_8c0;
  iStack_8ac = local_8c0;
  iStack_8a8 = local_8c0;
  iStack_8a4 = local_8c0;
  local_320 = auVar27;
  local_300 = auVar28;
  local_2e0 = auVar29;
  idct64_stage11_avx2(&local_820,out,do_cols,bd,out_shift,(__m256i *)&local_8c0,
                      (__m256i *)&local_8e0);
  return;
}

Assistant:

static void idct64_low16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}